

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void test_point_times_order(secp256k1_gej *point)

{
  int iVar1;
  size_t psize;
  uchar pub [65];
  secp256k1_ge res3;
  secp256k1_gej res2;
  secp256k1_gej res1;
  secp256k1_scalar nx;
  secp256k1_scalar x;
  secp256k1_scalar *in_stack_000006b8;
  secp256k1_scalar *in_stack_000006c0;
  secp256k1_gej *in_stack_000006c8;
  secp256k1_gej *in_stack_000006d0;
  size_t *in_stack_fffffffffffffdc8;
  uchar *pub_00;
  secp256k1_ge *in_stack_fffffffffffffdd8;
  secp256k1_scalar *in_stack_fffffffffffffde0;
  secp256k1_ge *in_stack_fffffffffffffdf0;
  secp256k1_ge *in_stack_fffffffffffffdf8;
  secp256k1_gej *in_stack_fffffffffffffe28;
  secp256k1_ge *in_stack_fffffffffffffe30;
  secp256k1_ge *in_stack_fffffffffffffe58;
  secp256k1_gej *in_stack_fffffffffffffe60;
  secp256k1_fe *in_stack_ffffffffffffffd8;
  secp256k1_gej *in_stack_ffffffffffffffe0;
  secp256k1_gej *in_stack_ffffffffffffffe8;
  secp256k1_gej *in_stack_fffffffffffffff0;
  
  pub_00 = (uchar *)0x41;
  testutil_random_scalar_order_test((secp256k1_scalar *)in_stack_fffffffffffffdf0);
  secp256k1_scalar_negate(in_stack_fffffffffffffde0,(secp256k1_scalar *)in_stack_fffffffffffffdd8);
  secp256k1_ecmult(in_stack_000006d0,in_stack_000006c8,in_stack_000006c0,in_stack_000006b8);
  secp256k1_ecmult(in_stack_000006d0,in_stack_000006c8,in_stack_000006c0,in_stack_000006b8);
  secp256k1_gej_add_var
            (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,
             in_stack_ffffffffffffffd8);
  iVar1 = secp256k1_gej_is_infinity((secp256k1_gej *)0x145233);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x10c2,"test condition failed: secp256k1_gej_is_infinity(&res1)");
    abort();
  }
  secp256k1_ge_set_gej(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  iVar1 = secp256k1_ge_is_infinity((secp256k1_ge *)0x145298);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x10c4,"test condition failed: secp256k1_ge_is_infinity(&res3)");
    abort();
  }
  iVar1 = secp256k1_ge_is_valid_var((secp256k1_ge *)in_stack_fffffffffffffe28);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x10c5,"test condition failed: secp256k1_ge_is_valid_var(&res3) == 0");
    abort();
  }
  iVar1 = secp256k1_eckey_pubkey_serialize
                    (in_stack_fffffffffffffdd8,pub_00,in_stack_fffffffffffffdc8,0);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x10c6,
            "test condition failed: secp256k1_eckey_pubkey_serialize(&res3, pub, &psize, 0) == 0");
    abort();
  }
  iVar1 = secp256k1_eckey_pubkey_serialize
                    (in_stack_fffffffffffffdd8,(uchar *)0x41,in_stack_fffffffffffffdc8,0);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x10c8,
            "test condition failed: secp256k1_eckey_pubkey_serialize(&res3, pub, &psize, 1) == 0");
    abort();
  }
  secp256k1_ecmult(in_stack_000006d0,in_stack_000006c8,in_stack_000006c0,in_stack_000006b8);
  secp256k1_ge_set_gej(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  iVar1 = secp256k1_ge_is_infinity((secp256k1_ge *)0x14543d);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x10cc,"test condition failed: secp256k1_ge_is_infinity(&res3)");
    abort();
  }
  secp256k1_ecmult(in_stack_000006d0,in_stack_000006c8,in_stack_000006c0,in_stack_000006b8);
  secp256k1_ge_set_gej(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  iVar1 = secp256k1_gej_eq_ge_var(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x10cf,"test condition failed: secp256k1_gej_eq_ge_var(point, &res3)");
    abort();
  }
  secp256k1_ecmult(in_stack_000006d0,in_stack_000006c8,in_stack_000006c0,in_stack_000006b8);
  secp256k1_ge_set_gej(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  iVar1 = secp256k1_ge_eq_var(in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x10d2,"test condition failed: secp256k1_ge_eq_var(&secp256k1_ge_const_g, &res3)");
    abort();
  }
  return;
}

Assistant:

static void test_point_times_order(const secp256k1_gej *point) {
    /* X * (point + G) + (order-X) * (pointer + G) = 0 */
    secp256k1_scalar x;
    secp256k1_scalar nx;
    secp256k1_gej res1, res2;
    secp256k1_ge res3;
    unsigned char pub[65];
    size_t psize = 65;
    testutil_random_scalar_order_test(&x);
    secp256k1_scalar_negate(&nx, &x);
    secp256k1_ecmult(&res1, point, &x, &x); /* calc res1 = x * point + x * G; */
    secp256k1_ecmult(&res2, point, &nx, &nx); /* calc res2 = (order - x) * point + (order - x) * G; */
    secp256k1_gej_add_var(&res1, &res1, &res2, NULL);
    CHECK(secp256k1_gej_is_infinity(&res1));
    secp256k1_ge_set_gej(&res3, &res1);
    CHECK(secp256k1_ge_is_infinity(&res3));
    CHECK(secp256k1_ge_is_valid_var(&res3) == 0);
    CHECK(secp256k1_eckey_pubkey_serialize(&res3, pub, &psize, 0) == 0);
    psize = 65;
    CHECK(secp256k1_eckey_pubkey_serialize(&res3, pub, &psize, 1) == 0);
    /* check zero/one edge cases */
    secp256k1_ecmult(&res1, point, &secp256k1_scalar_zero, &secp256k1_scalar_zero);
    secp256k1_ge_set_gej(&res3, &res1);
    CHECK(secp256k1_ge_is_infinity(&res3));
    secp256k1_ecmult(&res1, point, &secp256k1_scalar_one, &secp256k1_scalar_zero);
    secp256k1_ge_set_gej(&res3, &res1);
    CHECK(secp256k1_gej_eq_ge_var(point, &res3));
    secp256k1_ecmult(&res1, point, &secp256k1_scalar_zero, &secp256k1_scalar_one);
    secp256k1_ge_set_gej(&res3, &res1);
    CHECK(secp256k1_ge_eq_var(&secp256k1_ge_const_g, &res3));
}